

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O1

Expr xor(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
        int argc)

{
  _Bool _Var1;
  long lVar2;
  uint uVar3;
  Expr EVar4;
  Expr EVar5;
  Expr expr;
  
  uVar3 = 0;
  if (0 < argc) {
    lVar2 = 0;
    do {
      EVar4._4_4_ = 0;
      EVar4.type = *(uint *)((long)&args->type + lVar2);
      EVar4.field_1.val_atom =
           ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&args->field_1 + lVar2))->val_atom;
      EVar4 = exec_eval(exec,callContext,EVar4);
      expr.field_1 = EVar4.field_1;
      expr._4_4_ = 0;
      expr.type = EVar4.type;
      _Var1 = is_true(exec,expr);
      uVar3 = uVar3 + _Var1;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar2);
    uVar3 = (uint)(uVar3 == 1);
  }
  EVar5._4_4_ = 0;
  EVar5.type = *(uint *)((long)&(exec->nil).type + (ulong)(uVar3 << 4));
  EVar5.field_1.val_atom =
       ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&(exec->nil).field_1 + (ulong)(uVar3 << 4)))->
       val_atom;
  return EVar5;
}

Assistant:

BUILTIN_FUNC(xor)
{
    int cnt = 0;
    for (int i = 0; i < argc; i++)
    {
        Expr val = exec_eval(exec, callContext, args[i]);
        if (is_true(exec, val))
            cnt++;
    }
    if (cnt == 1)
        return exec->t;
    else
        return exec->nil;

}